

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace.c
# Opt level: O2

int multifast_replace(AC_TRIE_t *thiz,AC_TEXT_t *instr,MF_REPLACE_MODE_t mode,
                     MF_REPLACE_CALBACK_f callback,void *param)

{
  size_t *psVar1;
  AC_PATTERN_t *pAVar2;
  ac_trie *paVar3;
  AC_TEXT_t *pAVar4;
  ACT_NODE_t *pAVar5;
  ulong uVar6;
  mf_replacement_nominee *pmVar7;
  long lVar8;
  size_t sVar9;
  size_t __n;
  ulong uVar10;
  size_t sVar11;
  ulong to_position;
  ACT_NODE_t *nod;
  int iVar12;
  
  if (thiz->trie_open == 0) {
    if ((thiz->repdata).has_replacement == 0) {
      iVar12 = -2;
    }
    else {
      (thiz->repdata).cbf = callback;
      (thiz->repdata).user = param;
      (thiz->repdata).replace_mode = mode;
      thiz->text = instr;
      uVar10 = 0;
      nod = thiz->last_node;
LAB_001084ef:
      if (uVar10 < instr->length) {
        pAVar5 = node_find_next_bs(nod,instr->astring[uVar10]);
        if (pAVar5 == (ACT_NODE_t *)0x0) {
          pAVar5 = nod->failure_node;
          if (pAVar5 != (ACT_NODE_t *)0x0) {
            nod = pAVar5;
          }
          uVar10 = uVar10 + (pAVar5 == (ACT_NODE_t *)0x0);
        }
        else {
          uVar10 = uVar10 + 1;
          nod = pAVar5;
          if ((pAVar5->final != 0) &&
             (pAVar2 = pAVar5->to_be_replaced, pAVar2 != (AC_PATTERN_t *)0x0)) {
            sVar11 = thiz->base_position + uVar10;
            uVar6 = sVar11 - (pAVar2->ptext).length;
            if ((thiz->repdata).replace_mode == MF_REPLACE_MODE_LAZY) {
              if (uVar6 < (thiz->repdata).curser) goto LAB_001084ef;
              sVar9 = (thiz->repdata).noms_size;
              if (sVar9 == 0) goto LAB_001085d8;
              pmVar7 = (thiz->repdata).noms;
              if (uVar6 < pmVar7[sVar9 - 1].position) goto LAB_001084ef;
LAB_00108564:
              if (sVar9 != (thiz->repdata).noms_capacity) goto LAB_001085e1;
              (thiz->repdata).noms_capacity = sVar9 + 0x80;
              pmVar7 = (mf_replacement_nominee *)realloc(pmVar7,(sVar9 + 0x80) * 0x10);
              (thiz->repdata).noms = pmVar7;
              sVar9 = (thiz->repdata).noms_size;
            }
            else {
              sVar9 = (thiz->repdata).noms_size;
              lVar8 = sVar9 * 0x10 + -8;
              while (sVar9 != 0) {
                pmVar7 = (thiz->repdata).noms;
                if ((ulong)(*(long *)((long)&pmVar7->pattern + lVar8) -
                           *(long *)(*(long *)((long)pmVar7 + lVar8 + -8) + 8)) < uVar6)
                goto LAB_00108564;
                (thiz->repdata).noms_size = sVar9 - 1;
                lVar8 = lVar8 + -0x10;
                sVar9 = sVar9 - 1;
              }
LAB_001085d8:
              if ((thiz->repdata).noms_capacity == 0) {
                (thiz->repdata).noms_capacity = 0x80;
                pmVar7 = (mf_replacement_nominee *)malloc(0x800);
                (thiz->repdata).noms = pmVar7;
                sVar9 = 0;
              }
              else {
                sVar9 = 0;
LAB_001085e1:
                pmVar7 = (thiz->repdata).noms;
              }
            }
            pmVar7[sVar9].pattern = pAVar2;
            pmVar7[sVar9].position = sVar11;
            (thiz->repdata).noms_size = sVar9 + 1;
          }
        }
        goto LAB_001084ef;
      }
      to_position = (instr->length + thiz->base_position) - nod->depth;
      mf_repdata_do_replace(&thiz->repdata,to_position);
      paVar3 = (thiz->repdata).trie;
      pAVar4 = paVar3->text;
      iVar12 = 0;
      psVar1 = &paVar3->base_position;
      uVar6 = 0;
      if (*psVar1 <= to_position) {
        uVar6 = to_position - *psVar1;
      }
      __n = pAVar4->length - uVar6;
      if (uVar6 <= pAVar4->length && __n != 0) {
        memcpy((thiz->repdata).backlog.astring + (thiz->repdata).backlog.length,
               pAVar4->astring + uVar6,__n);
        psVar1 = &(thiz->repdata).backlog.length;
        *psVar1 = *psVar1 + (pAVar4->length - uVar6);
      }
      thiz->last_node = nod;
      thiz->base_position = thiz->base_position + uVar10;
    }
  }
  else {
    iVar12 = -1;
  }
  return iVar12;
}

Assistant:

int multifast_replace (AC_TRIE_t *thiz, AC_TEXT_t *instr, 
        MF_REPLACE_MODE_t mode, MF_REPLACE_CALBACK_f callback, void *param)
{
    ACT_NODE_t *current;
    ACT_NODE_t *next;
    struct mf_replacement_nominee nom;
    MF_REPLACEMENT_DATA_t *rd = &thiz->repdata;
    
    size_t position_r = 0;  /* Relative current position in the input string */
    size_t backlog_pos = 0; /* Relative backlog position in the input string */
    
    if (thiz->trie_open)
        return -1; /* _finalize() must be called first */
    
    if (!rd->has_replacement)
        return -2; /* Trie doesn't have any to-be-replaced pattern */
    
    rd->cbf = callback;
    rd->user = param;
    rd->replace_mode = mode;
    
    thiz->text = instr; /* Save the input string in a helper variable 
                         * for convenience */
    
    current = thiz->last_node;
    
    /* Main replace loop: 
     * Find patterns and bookmark them 
     */
    while (position_r < instr->length)
    {
        if (!(next = node_find_next_bs(current, instr->astring[position_r])))
        {
            /* Failed to follow a pattern */
            if(current->failure_node)
                current = current->failure_node;
            else
                position_r++;
        }
        else
        {
            current = next;
            position_r++;
        }
        
        if (current->final && next)
        {
            /* Bookmark nominee patterns for replacement */
            nom.pattern = current->to_be_replaced;
            nom.position = thiz->base_position + position_r;
            
            mf_repdata_booknominee (rd, &nom);
        }
    }
    
    /* 
     * At the end of input chunk, if the tail of the chunk is a prefix of a
     * pattern, then we must keep it in the backlog buffer and wait for the 
     * next chunk to decide about it. */
    
    backlog_pos = thiz->base_position + instr->length - current->depth;
    
    /* Now replace the patterns up to the backlog_pos point */
    mf_repdata_do_replace (rd, backlog_pos);
    
    /* Save the remaining to the backlog buffer */
    mf_repdata_savetobacklog (rd, backlog_pos);
    
    /* Save status variables */
    thiz->last_node = current;
    thiz->base_position += position_r;
    
    return 0;
}